

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<cbtCollisionShape_*>::copy
          (cbtAlignedObjectArray<cbtCollisionShape_*> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  long in_RCX;
  int i;
  
  for (lVar1 = (long)(int)dst; lVar1 < (int)src; lVar1 = lVar1 + 1) {
    *(cbtCollisionShape **)(in_RCX + lVar1 * 8) = this->m_data[lVar1];
  }
  return (int)lVar1;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}